

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_mgr.cxx
# Opt level: O2

uint64_t nuraft::raft_server::get_stat_counter(string *name)

{
  stat_elem *psVar1;
  uint64_t uVar2;
  long lStack_10;
  
  stat_mgr::get_instance();
  psVar1 = stat_mgr::get_stat(&stat_mgr::get_instance::mgr_instance,name);
  if (psVar1 == (stat_elem *)0x0) {
LAB_00126918:
    uVar2 = 0;
  }
  else {
    if (psVar1->stat_type_ == COUNTER) {
      lStack_10 = 0x28;
    }
    else {
      if (psVar1->stat_type_ != GAUGE) goto LAB_00126918;
      lStack_10 = 0x30;
    }
    uVar2 = *(uint64_t *)((long)&psVar1->stat_type_ + lStack_10);
  }
  return uVar2;
}

Assistant:

uint64_t raft_server::get_stat_counter(const std::string& name) {
    stat_elem* elem = stat_mgr::get_instance()->get_stat(name);
    if (!elem) return 0;
    // Tolerate type cast between counter and gauge.
    if (elem->get_type() == stat_elem::COUNTER) {
        return elem->get_counter();
    } else if (elem->get_type() == stat_elem::GAUGE) {
        return elem->get_gauge();
    }
    return 0;
}